

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecode.c
# Opt level: O3

sysbvm_tuple_t
sysbvm_bytecodeInterpreter_interpretSendWithReceiverTypeNoCopyArguments
          (sysbvm_context_t *context,sysbvm_pic_t *pic,sysbvm_tuple_t receiverType,
          sysbvm_tuple_t selector,size_t argumentCount,sysbvm_tuple_t *receiverAndArguments,
          sysbvm_bitflags_t applicationFlags)

{
  _Bool _Var1;
  sysbvm_tuple_t sVar2;
  size_t sVar3;
  sysbvm_tuple_t local_50;
  sysbvm_tuple_t local_48;
  sysbvm_tuple_t local_40;
  
  if (pic == (sysbvm_pic_t *)0x0) {
    sysbvm_error_assertionFailure
              (
              "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/lib/sysbvm/bytecode.c:155: assertion failure: pic"
              );
  }
  local_50 = 0;
  _Var1 = sysbvm_pic_lookupTypeAndSelector(pic,selector,receiverType,&local_50);
  if (!_Var1) {
    local_50 = sysbvm_type_lookupSelector(context,receiverType,selector);
    sysbvm_pic_addSelectorTypeAndMethod(pic,selector,receiverType,local_50);
  }
  if (local_50 == 0) {
    if (((context->roots).doesNotUnderstandSelector != selector) &&
       (local_50 = sysbvm_type_lookupSelector(context,receiverType,selector), local_50 != 0)) {
      sVar2 = sysbvm_array_create(context,argumentCount);
      if (argumentCount != 0) {
        sVar3 = 0;
        do {
          if ((sVar2 & 0xf) == 0 && sVar2 != 0) {
            *(sysbvm_tuple_t *)(sVar2 + 0x10 + sVar3 * 8) = receiverAndArguments[sVar3 + 1];
          }
          sVar3 = sVar3 + 1;
        } while (argumentCount != sVar3);
      }
      local_40 = sysbvm_message_create(context,selector,sVar2,receiverType,0);
      local_48 = *receiverAndArguments;
      sVar2 = sysbvm_function_apply(context,local_50,2,&local_48,0);
      return sVar2;
    }
    sysbvm_error("Message not understood");
  }
  sVar2 = sysbvm_bytecodeInterpreter_functionApplyNoCopyArguments
                    (context,local_50,argumentCount + 1,receiverAndArguments,applicationFlags);
  return sVar2;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_bytecodeInterpreter_interpretSendWithReceiverTypeNoCopyArguments(sysbvm_context_t *context, sysbvm_pic_t *pic, sysbvm_tuple_t receiverType, sysbvm_tuple_t selector, size_t argumentCount, sysbvm_tuple_t *receiverAndArguments, sysbvm_bitflags_t applicationFlags)
{
    SYSBVM_ASSERT(pic);
    sysbvm_tuple_t method = SYSBVM_NULL_TUPLE;
    if(!sysbvm_pic_lookupTypeAndSelector(pic, selector, receiverType, &method))
    {
        method = sysbvm_type_lookupSelector(context, receiverType, selector);
        sysbvm_pic_addSelectorTypeAndMethod(pic, selector, receiverType, method);
    }

    if(method)
        return sysbvm_bytecodeInterpreter_functionApplyNoCopyArguments(context, method, argumentCount + 1, receiverAndArguments, applicationFlags);

    // Attempt to send doesNotUnderstand:
    if(selector != context->roots.doesNotUnderstandSelector)
        method = sysbvm_type_lookupSelector(context, receiverType, selector);
    if(!method)
        sysbvm_error("Message not understood");

    // Make the message.
    sysbvm_tuple_t arguments = sysbvm_array_create(context, argumentCount);
    for(size_t i = 0; i < argumentCount; ++i)
        sysbvm_array_atPut(arguments, i, receiverAndArguments[1 + i]);

    sysbvm_tuple_t message = sysbvm_message_create(context, selector, arguments, receiverType, SYSBVM_NULL_TUPLE);
    return sysbvm_function_apply2(context, method, receiverAndArguments[0], message);
}